

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

bool __thiscall QLayoutPrivate::checkLayout(QLayoutPrivate *this,QLayout *otherLayout)

{
  QLayout *pQVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  QLayout *in_RSI;
  QLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  QLayout *q;
  char *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  QMessageLogger *in_stack_ffffffffffffff60;
  bool local_79;
  QString local_78;
  char local_60 [32];
  QString local_40;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = q_func(in_RDI);
  if (in_RSI == (QLayout *)0x0) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
               in_stack_ffffffffffffff48);
    (*(code *)**(undefined8 **)pQVar1)();
    uVar2 = QMetaObject::className();
    QObject::objectName();
    QtPrivate::asString(&local_40);
    uVar3 = QString::utf16();
    QMessageLogger::warning(local_28,"QLayout: Cannot add a null layout to %s/%ls",uVar2,uVar3);
    QString::~QString((QString *)0x33ea83);
    local_79 = false;
  }
  else if (in_RSI == pQVar1) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
               in_stack_ffffffffffffff48);
    (*(code *)**(undefined8 **)pQVar1)();
    uVar2 = QMetaObject::className();
    QObject::objectName();
    QtPrivate::asString(&local_78);
    uVar3 = QString::utf16();
    QMessageLogger::warning(local_60,"QLayout: Cannot add layout %s/%ls to itself",uVar2,uVar3);
    QString::~QString((QString *)0x33eb14);
    local_79 = false;
  }
  else {
    local_79 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_79;
  }
  __stack_chk_fail();
}

Assistant:

bool QLayoutPrivate::checkLayout(QLayout *otherLayout) const
{
    Q_Q(const QLayout);
    if (Q_UNLIKELY(!otherLayout)) {
        qWarning("QLayout: Cannot add a null layout to %s/%ls",
                 q->metaObject()->className(), qUtf16Printable(q->objectName()));
        return false;
    }
    if (Q_UNLIKELY(otherLayout == q)) {
        qWarning("QLayout: Cannot add layout %s/%ls to itself",
                 q->metaObject()->className(), qUtf16Printable(q->objectName()));
        return false;
    }
    return true;
}